

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::write_double<double>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,double value,format_specs *spec)

{
  core_format_specs spec_00;
  bool bVar1;
  alignment aVar2;
  value_type *pvVar3;
  align_spec *in_RSI;
  buffer *in_RDI;
  double in_XMM0_Qa;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  bool use_grisu;
  memory_buffer buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler handler;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  undefined7 in_stack_fffffffffffffce0;
  value_type in_stack_fffffffffffffce7;
  char *in_stack_fffffffffffffce8;
  write_inf_or_nan_t *in_stack_fffffffffffffcf0;
  char local_2f1;
  double in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd21;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> local_2d0;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *local_2b0;
  undefined8 local_2a4;
  alignment local_29c;
  size_t local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined1 uStack_278;
  char cStack_277;
  undefined2 uStack_276;
  undefined1 local_26d;
  allocator<char> local_259;
  basic_buffer<char> local_258 [4];
  double_writer *in_stack_fffffffffffffe40;
  align_spec *in_stack_fffffffffffffe48;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_fffffffffffffe50;
  char local_1b;
  float_spec_handler local_1a;
  align_spec *local_18;
  double local_10;
  
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  float_spec_handler::float_spec_handler(&local_1a,*(char *)((long)&in_RSI[1].fill_ + 1));
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>
            (in_stack_fffffffffffffce7,
             (float_spec_handler *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  local_1b = '\0';
  bVar1 = std::signbit(local_10);
  if (bVar1) {
    local_1b = '-';
    local_10 = -local_10;
  }
  else {
    bVar1 = core_format_specs::has((core_format_specs *)(local_18 + 1),1);
    if (bVar1) {
      bVar1 = core_format_specs::has((core_format_specs *)(local_18 + 1),2);
      local_2f1 = '+';
      if (!bVar1) {
        local_2f1 = ' ';
      }
      local_1b = local_2f1;
    }
  }
  bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<double>
                    ((double)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  if (bVar1) {
    write_double<double>::write_inf_or_nan_t::operator()
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  else {
    bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<double>
                      ((double)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    if (bVar1) {
      write_double<double>::write_inf_or_nan_t::operator()
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      std::allocator<char>::~allocator(&local_259);
      local_26d = 0;
      uStack_278 = (undefined1)local_18[1].fill_;
      uStack_276 = (undefined2)((uint)local_18[1].fill_ >> 0x10);
      local_288._0_4_ = local_18->width_;
      local_288._4_4_ = local_18->fill_;
      uStack_280 = (undefined4)*(undefined8 *)&local_18->align_;
      uStack_27c = (undefined4)((ulong)*(undefined8 *)&local_18->align_ >> 0x20);
      cStack_277 = local_1a.type;
      local_290 = CONCAT26(uStack_276,CONCAT15(local_1a.type,CONCAT14(uStack_278,uStack_27c)));
      spec_00._1_7_ = in_stack_fffffffffffffd21;
      spec_00.precision._0_1_ = in_stack_fffffffffffffd20;
      internal::sprintf_format<double>(in_stack_fffffffffffffd18,in_RDI,spec_00);
      local_298 = internal::basic_buffer<char>::size(local_258);
      local_2a4._0_4_ = local_18->width_;
      local_2a4._4_4_ = local_18->fill_;
      local_29c = local_18->align_;
      aVar2 = align_spec::align(local_18);
      if (aVar2 == ALIGN_NUMERIC) {
        if (local_1b != '\0') {
          local_2b0 = reserve((basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                               *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                              CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
          internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++
                    ((truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)
                     CONCAT17(local_1b,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc);
          pvVar3 = internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::
                   operator*(&local_2d0);
          *pvVar3 = local_1b;
          in_stack_fffffffffffffce7 = local_1b;
          if ((int)local_2a4 != 0) {
            local_2a4 = CONCAT44(local_2a4._4_4_,(int)local_2a4 + -1);
          }
        }
        local_29c = ALIGN_RIGHT;
      }
      else {
        aVar2 = align_spec::align(local_18);
        if (aVar2 == ALIGN_DEFAULT) {
          local_29c = ALIGN_RIGHT;
        }
        if (local_1b != '\0') {
          local_298 = local_298 + 1;
        }
      }
      basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      ::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::double_writer>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}